

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall
gvr::PointCloud::resizeVertexList(PointCloud *this,int vn,bool with_scanprop,bool with_scanpos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  float *p;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  void *local_18;
  int local_c [3];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ESI * 3);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_c[0] = in_ESI;
  pvVar5 = operator_new__(uVar4);
  piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
  local_1c = *piVar6 * 3;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined4 *)((long)pvVar5 + (long)local_1c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x90) + (long)local_1c * 4);
  }
  piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
  for (local_20 = *piVar6 * 3; SBORROW4(local_20,local_c[0] * 3) != local_20 + local_c[0] * -3 < 0;
      local_20 = local_20 + 1) {
    *(undefined4 *)((long)pvVar5 + (long)local_20 * 4) = 0;
  }
  if (*(void **)(in_RDI + 0x90) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x90));
  }
  *(void **)(in_RDI + 0x90) = pvVar5;
  local_18 = (void *)0x0;
  if ((in_DL & 1) != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(local_c[0] * 3);
    uVar4 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_18 = operator_new__(uVar4);
    piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
    local_24 = *piVar6 * 3;
    while (local_24 = local_24 + -1, -1 < local_24) {
      *(undefined4 *)((long)local_18 + (long)local_24 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x98) + (long)local_24 * 4);
    }
    piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
    for (local_28 = *piVar6; local_28 < local_c[0]; local_28 = local_28 + 1) {
      *(undefined4 *)((long)local_18 + (long)(local_28 * 3) * 4) = 0;
      *(undefined4 *)((long)local_18 + (long)(local_28 * 3 + 1) * 4) = 0;
      *(undefined4 *)((long)local_18 + (long)(local_28 * 3 + 2) * 4) = 0x3f800000;
    }
  }
  if (*(void **)(in_RDI + 0x98) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x98));
  }
  *(void **)(in_RDI + 0x98) = local_18;
  local_18 = (void *)0x0;
  if ((in_CL & 1) != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(local_c[0] * 3);
    uVar4 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_18 = operator_new__(uVar4);
    piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
    local_2c = *piVar6 * 3;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      *(undefined4 *)((long)local_18 + (long)local_2c * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0xa0) + (long)local_2c * 4);
    }
    piVar6 = std::min<int>((int *)(in_RDI + 0x88),local_c);
    for (local_30 = *piVar6 * 3; SBORROW4(local_30,local_c[0] * 3) != local_30 + local_c[0] * -3 < 0
        ; local_30 = local_30 + 1) {
      *(undefined4 *)((long)local_18 + (long)local_30 * 4) = 0;
    }
  }
  if (*(void **)(in_RDI + 0xa0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xa0));
  }
  *(void **)(in_RDI + 0xa0) = local_18;
  *(int *)(in_RDI + 0x88) = local_c[0];
  return;
}

Assistant:

void PointCloud::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(n, vn)-1; i>=0; i--)
  {
    p[i]=vertex[i];
  }

  for (int i=3*std::min(n, vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] vertex;

  vertex=p;
  p=0;

  if (with_scanprop)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanprop[i];
    }

    for (int i=std::min(n, vn); i<vn; i++)
    {
      p[3*i]=0;
      p[3*i+1]=0;
      p[3*i+2]=1;
    }
  }

  delete [] scanprop;

  scanprop=p;
  p=0;

  if (with_scanpos)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanpos[i];
    }

    for (int i=3*std::min(n, vn); i<3*vn; i++)
    {
      p[i]=0;
    }
  }

  delete [] scanpos;

  scanpos=p;

  n=vn;
}